

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O3

void qt_punycodeEncoder(QStringView in,QString *output)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  Data *pDVar3;
  uint uVar4;
  uint uVar5;
  char16_t *pcVar6;
  storage_type_conflict *psVar7;
  storage_type_conflict *psVar8;
  int iVar9;
  char *__file;
  uint uVar10;
  uint uVar11;
  long lVar12;
  storage_type_conflict *__length;
  uint uVar13;
  storage_type_conflict *psVar14;
  char16_t *pcVar15;
  bool bVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  QLatin1StringView str;
  
  psVar14 = in.m_data;
  lVar19 = in.m_size;
  if (lVar19 < 0x7f) {
    iVar9 = (int)(output->d).size;
    __file = (char *)(long)iVar9;
    QString::resize(output,(qsizetype)(__file + lVar19));
    pDVar3 = (output->d).d;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(output,(output->d).size,KeepSize);
    }
    if (lVar19 != 0) {
      pcVar6 = (output->d).ptr;
      psVar1 = psVar14 + lVar19;
      pcVar15 = pcVar6 + (long)__file;
      lVar12 = 0;
      bVar16 = false;
      do {
        if ((ushort)*(char16_t *)((long)psVar14 + lVar12) < 0x80) {
          *pcVar15 = *(char16_t *)((long)psVar14 + lVar12);
          pcVar15 = pcVar15 + 1;
        }
        else {
          bVar16 = true;
        }
        lVar12 = lVar12 + 2;
      } while (lVar19 * 2 != lVar12);
      if (bVar16) {
        if (pcVar6 == (char16_t *)0x0) {
          pcVar6 = &QString::_empty;
        }
        QString::truncate(output,(char *)((long)pcVar15 - (long)pcVar6 >> 1),lVar12);
        uVar4 = (int)(output->d).size - iVar9;
        if (uVar4 != 0) {
          QString::append(output,(QChar)0x2d);
        }
        if (0 < lVar19) {
          uVar17 = 0;
          psVar8 = psVar14;
          do {
            psVar7 = psVar8 + 1;
            if (((ushort)*psVar8 & 0xf800) == 0xd800) {
              uVar13 = (ushort)*psVar8 & 0xdc00;
              __length = (storage_type_conflict *)(ulong)uVar13;
              if (((uVar13 != 0xd800) || (psVar1 <= psVar7)) || ((*psVar7 & 0xfc00U) != 0xdc00))
              goto LAB_002636b2;
              psVar7 = psVar8 + 2;
            }
            uVar17 = uVar17 + 1;
            psVar8 = psVar7;
          } while (psVar7 < psVar1);
          if (uVar4 < uVar17) {
            uVar22 = 0;
            uVar20 = 0x48;
            uVar5 = 0x80;
            uVar13 = uVar4;
            do {
              if (lVar19 < 1) {
                uVar10 = 0xffffffff;
              }
              else {
                uVar10 = 0xffffffff;
                psVar8 = psVar14;
                do {
                  sVar2 = *psVar8;
                  uVar11 = (uint)(ushort)sVar2;
                  if ((sVar2 & 0xfc00U) == 0xd800) {
                    psVar7 = psVar8 + 1;
                    psVar8 = psVar8 + 2;
                    uVar11 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)*psVar7 + 0xfca02400;
                  }
                  else {
                    psVar8 = psVar8 + 1;
                  }
                  uVar21 = uVar10;
                  if (uVar11 < uVar10) {
                    uVar21 = uVar11;
                  }
                  if (uVar11 < uVar5) {
                    uVar21 = uVar10;
                  }
                  uVar10 = uVar21;
                } while (psVar8 < psVar1);
              }
              lVar12 = (ulong)(uVar10 - uVar5) * (ulong)(uVar13 + 1);
              uVar11 = (uint)((ulong)lVar12 >> 0x20);
              __length = (storage_type_conflict *)(ulong)uVar11;
              uVar5 = (uint)lVar12;
              if ((uVar11 != 0) || (uVar11 = uVar22 + uVar5, CARRY4(uVar22,uVar5))) {
LAB_002636b2:
                QString::truncate(output,__file,(__off_t)__length);
                return;
              }
              __length = psVar14;
              if (0 < lVar19) {
                do {
                  sVar2 = *__length;
                  uVar5 = (uint)(ushort)sVar2;
                  if ((sVar2 & 0xfc00U) == 0xd800) {
                    psVar8 = __length + 1;
                    __length = __length + 2;
                    uVar5 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)*psVar8 + 0xfca02400;
                  }
                  else {
                    __length = __length + 1;
                  }
                  if ((uVar5 < uVar10) && (uVar11 = uVar11 + 1, uVar11 == 0)) goto LAB_002636b2;
                  if (uVar5 == uVar10) {
                    uVar5 = -(uVar20 - 0x24);
                    if (uVar20 + 0x1a < 0x25) {
                      uVar5 = 0x1a;
                    }
                    if (0x23 < uVar20) {
                      uVar5 = 1;
                    }
                    uVar22 = uVar11;
                    if (uVar5 <= uVar11) {
                      uVar21 = 0x48;
                      uVar23 = (ulong)uVar11;
                      do {
                        uVar22 = (int)uVar23 - uVar5;
                        uVar23 = (ulong)uVar22 / (ulong)(0x24 - uVar5);
                        uVar22 = uVar22 % (0x24 - uVar5);
                        uVar18 = uVar22 + uVar5;
                        uVar5 = uVar22 + uVar5 + 0x4b;
                        if (0x19 < uVar18) {
                          uVar5 = uVar18;
                        }
                        uVar22 = (uint)uVar23;
                        QString::append(output,(QChar)((short)uVar5 + L'\x16'));
                        uVar5 = uVar21 - uVar20;
                        if (uVar20 + 0x1a <= uVar21) {
                          uVar5 = 0x1a;
                        }
                        if (uVar21 <= uVar20) {
                          uVar5 = 1;
                        }
                        uVar21 = uVar21 + 0x24;
                      } while (uVar5 <= uVar22);
                    }
                    uVar5 = uVar22 + 0x4b;
                    if (0x19 < uVar22) {
                      uVar5 = uVar22;
                    }
                    QString::append(output,(QChar)((short)uVar5 + L'\x16'));
                    uVar5 = 2;
                    if (uVar13 == uVar4) {
                      uVar5 = 700;
                    }
                    uVar13 = uVar13 + 1;
                    uVar5 = (int)(((ulong)uVar11 / (ulong)uVar5) / (ulong)uVar13) +
                            (int)((ulong)uVar11 / (ulong)uVar5);
                    if (uVar5 < 0x1c8) {
                      iVar9 = 0;
                    }
                    else {
                      iVar9 = 0;
                      uVar22 = uVar5;
                      do {
                        uVar5 = uVar22 / 0x23;
                        iVar9 = iVar9 + 0x24;
                        bVar16 = 0x3e57 < uVar22;
                        uVar22 = uVar5;
                      } while (bVar16);
                    }
                    uVar20 = (uVar5 * 0x24 & 0xffff) / (uVar5 + 0x26 & 0xffff) + iVar9;
                    uVar11 = 0;
                  }
                } while (__length < psVar1);
              }
              uVar22 = uVar11 + 1;
              uVar5 = uVar10 + 1;
            } while (uVar13 < uVar17);
          }
        }
        str.m_data = "xn--";
        str.m_size = 4;
        QString::insert(output,(qsizetype)__file,str);
        return;
      }
    }
  }
  return;
}

Assistant:

Q_AUTOTEST_EXPORT void qt_punycodeEncoder(QStringView in, QString *output)
{
    uint n = initial_n;
    uint delta = 0;
    uint bias = initial_bias;

    // Do not try to encode strings that certainly will result in output
    // that is longer than allowable domain name label length. Note that
    // non-BMP codepoints are encoded as two QChars.
    if (in.size() > MaxDomainLabelLength * 2)
        return;

    int outLen = output->size();
    output->resize(outLen + in.size());

    QChar *d = output->data() + outLen;
    bool skipped = false;
    // copy all basic code points verbatim to output.
    for (QChar c : in) {
        if (c.unicode() < 0x80)
            *d++ = c;
        else
            skipped = true;
    }

    // if there were only basic code points, just return them
    // directly; don't do any encoding.
    if (!skipped)
        return;

    output->truncate(d - output->constData());
    int copied = output->size() - outLen;

    // h and b now contain the number of basic code points in input.
    uint b = copied;
    uint h = copied;

    // if basic code points were copied, add the delimiter character.
    if (h > 0)
        *output += u'-';

    // compute the input length in Unicode code points.
    uint inputLength = 0;
    for (QStringIterator iter(in); iter.hasNext();) {
        inputLength++;

        if (iter.next(char32_t(-1)) == char32_t(-1)) {
            output->truncate(outLen);
            return; // invalid surrogate pair
        }
    }

    // while there are still unprocessed non-basic code points left in
    // the input string...
    while (h < inputLength) {
        // find the character in the input string with the lowest unprocessed value.
        uint m = std::numeric_limits<uint>::max();
        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();
            static_assert(std::numeric_limits<decltype(m)>::max()
                                  >= std::numeric_limits<decltype(c)>::max(),
                          "Punycode uint should be able to cover all codepoints");
            if (c >= n && c < m)
                m = c;
        }

        // delta = delta + (m - n) * (h + 1), fail on overflow
        uint tmp;
        if (qMulOverflow<uint>(m - n, h + 1, &tmp) || qAddOverflow<uint>(delta, tmp, &delta)) {
            output->truncate(outLen);
            return; // punycode_overflow
        }
        n = m;

        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();

            // increase delta until we reach the character processed in this iteration;
            // fail if delta overflows.
            if (c < n) {
                if (qAddOverflow<uint>(delta, 1, &delta)) {
                    output->truncate(outLen);
                    return; // punycode_overflow
                }
            }

            if (c == n) {
                appendEncode(output, delta, bias);

                bias = adapt(delta, h + 1, h == b);
                delta = 0;
                ++h;
            }
        }

        ++delta;
        ++n;
    }

    // prepend ACE prefix
    output->insert(outLen, "xn--"_L1);
    return;
}